

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O2

void * __thiscall Centaurus::Stage2Runner::acquire_bank(Stage2Runner *this)

{
  void *pvVar1;
  TransferListener p_Var2;
  long lVar3;
  bool bVar4;
  undefined8 in_RAX;
  long lVar5;
  undefined4 uStack_38;
  WindowBankState old_state;
  
  _uStack_38 = in_RAX;
  BaseRunner::wait_on_semaphore((BaseRunner *)this);
  pvVar1 = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window;
  lVar3 = 0;
  while( true ) {
    do {
      lVar5 = lVar3;
      lVar3 = 0;
    } while ((this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num <= lVar5);
    _uStack_38 = CONCAT44(2,uStack_38);
    bVar4 = std::atomic<Centaurus::BaseRunner::WindowBankState>::compare_exchange_weak
                      ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                       ((long)pvVar1 + lVar5 * 8 + 4),&old_state,Stage2_Locked,memory_order_seq_cst)
    ;
    if (bVar4) break;
    if (old_state == YouAreDone) {
      return (void *)0x0;
    }
    lVar3 = lVar5 + 1;
  }
  p_Var2 = (this->super_NonRecursiveReductionRunner).m_xferlistener;
  if (p_Var2 != (TransferListener)0x0) {
    (*p_Var2)(-1,*(int *)((long)pvVar1 + lVar5 * 8),
              (this->super_NonRecursiveReductionRunner).m_listener_context);
  }
  this->m_current_bank = (int)lVar5;
  return (void *)(lVar5 * (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size +
                 (long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_main_window);
}

Assistant:

void *acquire_bank()
  {
    wait_on_semaphore();
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Stage1_Unlocked;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage2_Locked)) {
          invoke_transfer_listener(-1, banks[i].number);
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        } else {
          if (old_state == WindowBankState::YouAreDone) {
            return NULL;
          }
        }
      }
    }
  }